

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O0

Fxu_Double * Fxu_MatrixFindDouble(Fxu_Matrix *p,int *piVarsC1,int *piVarsC2,int nVarsC1,int nVarsC2)

{
  uint uVar1;
  uint Key;
  Fxu_Pair *pPair;
  Fxu_Double *pDouble;
  int local_360;
  int i;
  int nVarsC2_;
  int nVarsC1_;
  int piVarsC2_ [100];
  int piVarsC1_ [100];
  int nVarsC2_local;
  int nVarsC1_local;
  int *piVarsC2_local;
  int *piVarsC1_local;
  Fxu_Matrix *p_local;
  
  if (nVarsC1 < 1) {
    __assert_fail("nVarsC1 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                  ,0x1db,"Fxu_Double *Fxu_MatrixFindDouble(Fxu_Matrix *, int *, int *, int, int)");
  }
  if (0 < nVarsC2) {
    if (*piVarsC2 <= *piVarsC1) {
      __assert_fail("piVarsC1[0] < piVarsC2[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                    ,0x1dd,"Fxu_Double *Fxu_MatrixFindDouble(Fxu_Matrix *, int *, int *, int, int)")
      ;
    }
    uVar1 = Fxu_PairHashKeyArray(p,piVarsC1,piVarsC2,nVarsC1,nVarsC2);
    pPair = (Fxu_Pair *)p->pTable[uVar1 % (uint)p->nTableSize].pHead;
    do {
      if (pPair == (Fxu_Pair *)0x0) {
        return (Fxu_Double *)0x0;
      }
      if ((pPair->pDiv->Num == nVarsC1) && (pPair->pDiv->HNum == nVarsC2)) {
        Fxu_MatrixGetDoubleVars(p,(Fxu_Double *)pPair,piVarsC2_ + 0x62,&nVarsC2_,&i,&local_360);
        for (pDouble._4_4_ = 0;
            (pDouble._4_4_ < nVarsC1 &&
            (piVarsC1[pDouble._4_4_] == piVarsC2_[(long)pDouble._4_4_ + 0x62]));
            pDouble._4_4_ = pDouble._4_4_ + 1) {
        }
        if (pDouble._4_4_ == nVarsC1) {
          for (pDouble._4_4_ = 0;
              (pDouble._4_4_ < nVarsC2 && (piVarsC2[pDouble._4_4_] == (&nVarsC2_)[pDouble._4_4_]));
              pDouble._4_4_ = pDouble._4_4_ + 1) {
          }
          if (pDouble._4_4_ == nVarsC2) {
            return (Fxu_Double *)pPair;
          }
        }
      }
      pPair = pPair->pDPrev;
    } while( true );
  }
  __assert_fail("nVarsC2 > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                ,0x1dc,"Fxu_Double *Fxu_MatrixFindDouble(Fxu_Matrix *, int *, int *, int, int)");
}

Assistant:

Fxu_Double * Fxu_MatrixFindDouble( Fxu_Matrix * p, 
     int piVarsC1[], int piVarsC2[], int nVarsC1, int nVarsC2 )
{
    int piVarsC1_[100], piVarsC2_[100];
    int nVarsC1_, nVarsC2_, i;
    Fxu_Double * pDouble;
    Fxu_Pair * pPair;
    unsigned Key;

    assert( nVarsC1 > 0 );
    assert( nVarsC2 > 0 );
    assert( piVarsC1[0] < piVarsC2[0] );

    // get the hash key
    Key = Fxu_PairHashKeyArray( p, piVarsC1, piVarsC2, nVarsC1, nVarsC2 );
    
    // check if the divisor for this pair already exists
    Key %= p->nTableSize;
	Fxu_TableForEachDouble( p, Key, pDouble )
    {
        pPair = pDouble->lPairs.pHead;
        if ( pPair->nLits1 != nVarsC1 )
            continue;
        if ( pPair->nLits2 != nVarsC2 )
            continue;
        // get the cubes of this divisor
        Fxu_MatrixGetDoubleVars( p, pDouble, piVarsC1_, piVarsC2_, &nVarsC1_, &nVarsC2_ );
        // compare lits of the first cube
        for ( i = 0; i < nVarsC1; i++ )
            if ( piVarsC1[i] != piVarsC1_[i] )
                break;
        if ( i != nVarsC1 )
            continue;
        // compare lits of the second cube
        for ( i = 0; i < nVarsC2; i++ )
            if ( piVarsC2[i] != piVarsC2_[i] )
                break;
        if ( i != nVarsC2 )
            continue;
        return pDouble;
    }
    return NULL;
}